

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O2

void __thiscall wasm::FunctionHasher::~FunctionHasher(FunctionHasher *this)

{
  ~FunctionHasher(this);
  operator_delete(this,0x158);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }